

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

iterator * __thiscall
google::
sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
::begin(iterator *__return_storage_ptr__,
       sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
       *this)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  pointer psVar4;
  pointer ppVar5;
  
  psVar1 = (this->table).groups.
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->table).groups.
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar4 = psVar1;
  if (psVar1 == psVar2) {
    ppVar5 = (pointer)0x0;
  }
  else {
    ppVar5 = psVar1->group;
    if (((psVar1->settings).num_buckets == 0) && (psVar4 = psVar1 + 1, psVar4 != psVar2)) {
      do {
        psVar3 = psVar4;
        psVar4 = psVar3;
        if ((psVar3->settings).num_buckets != 0) break;
        psVar4 = psVar3 + 1;
      } while (psVar4 != psVar2);
      ppVar5 = psVar3->group;
    }
  }
  __return_storage_ptr__->ht = this;
  (__return_storage_ptr__->pos).row_begin._M_current = psVar1;
  (__return_storage_ptr__->pos).row_end._M_current = psVar2;
  (__return_storage_ptr__->pos).row_current._M_current = psVar4;
  (__return_storage_ptr__->pos).col_current = ppVar5;
  (__return_storage_ptr__->end).row_begin._M_current = psVar1;
  (__return_storage_ptr__->end).row_end._M_current = psVar2;
  (__return_storage_ptr__->end).row_current._M_current = psVar2;
  (__return_storage_ptr__->end).col_current = (nonempty_iterator)0x0;
  sparse_hashtable_iterator<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::advance_past_deleted(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

iterator begin() {
    return iterator(this, table.nonempty_begin(), table.nonempty_end());
  }